

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_NtkSuppSizeTest(Au_Ntk_t *p)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  iVar3 = (p->vObjs).nSize;
  if (iVar3 < 1) {
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      lVar4 = (long)iVar3;
      if (lVar4 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (p->vObjs).pArray[lVar7];
      pvVar2 = (p->vPages).pArray[(int)uVar1 >> 0xc];
      uVar5 = (ulong)((uVar1 & 0xfff) << 4);
      if ((~*(ulong *)((long)pvVar2 + uVar5) & 0x700000000) == 0) {
        iVar3 = Au_ObjSuppSize((Au_Obj_t *)((long)pvVar2 + uVar5));
        uVar6 = uVar6 + (iVar3 < 0x11);
        iVar3 = (p->vObjs).nSize;
        lVar4 = (long)iVar3;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar4);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar6,(ulong)(uint)p->nObjs[7]);
  return uVar6;
}

Assistant:

int Au_NtkSuppSizeTest( Au_Ntk_t * p )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    Au_NtkForEachObj( p, pObj, i )
        if ( Au_ObjIsNode(pObj) )
            Counter += (Au_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Au_NtkNodeNum(p) );
    return Counter;
}